

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::DebugInfoManager::RegisterDbgDeclare
          (DebugInfoManager *this,uint32_t var_id,Instruction *dbg_declare)

{
  CommonDebugInfoInstructions CVar1;
  iterator iVar2;
  _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
  *this_00;
  uint32_t local_2c;
  Instruction *local_28;
  Instruction *local_20;
  
  local_2c = var_id;
  local_20 = dbg_declare;
  CVar1 = Instruction::GetCommonDebugOpcode(dbg_declare);
  if (CVar1 != CommonDebugInfoDebugDeclare) {
    CVar1 = Instruction::GetCommonDebugOpcode(dbg_declare);
    if (CVar1 != CommonDebugInfoDebugValue) {
      __assert_fail("dbg_declare->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare || dbg_declare->GetCommonDebugOpcode() == CommonDebugInfoDebugValue"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                    ,0x8d,
                    "void spvtools::opt::analysis::DebugInfoManager::RegisterDbgDeclare(uint32_t, Instruction *)"
                   );
    }
  }
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->var_id_to_dbg_decl_)._M_h,&local_2c);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_28 = dbg_declare;
    this_00 = (_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
               *)std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->var_id_to_dbg_decl_,&local_2c);
    std::
    _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
    ::_M_assign_unique<spvtools::opt::Instruction*const*>(this_00,&local_28,&local_20);
  }
  else {
    std::
    _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
    ::_M_insert_unique<spvtools::opt::Instruction*const&>
              ((_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
                *)((long)iVar2.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                         ._M_cur + 0x10),&local_20);
  }
  return;
}

Assistant:

void DebugInfoManager::RegisterDbgDeclare(uint32_t var_id,
                                          Instruction* dbg_declare) {
  assert(dbg_declare->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare ||
         dbg_declare->GetCommonDebugOpcode() == CommonDebugInfoDebugValue);
  auto dbg_decl_itr = var_id_to_dbg_decl_.find(var_id);
  if (dbg_decl_itr == var_id_to_dbg_decl_.end()) {
    var_id_to_dbg_decl_[var_id] = {dbg_declare};
  } else {
    dbg_decl_itr->second.insert(dbg_declare);
  }
}